

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
EnumerateObjects(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                 *this,ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction)

{
  _func_void_void_ptr_size_t *CallBackFunction_local;
  ObjectInfoBits infoBits_local;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  UpdateAllocators(this);
  HeapBucket::EnumerateObjects<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
            (this->fullBlockList,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
            (this->heapBlockList,infoBits,CallBackFunction);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    UpdateAllocators();
    HeapBucket::EnumerateObjects(fullBlockList, infoBits, CallBackFunction);
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBucket::EnumerateObjects(sweepableHeapBlockList, infoBits, CallBackFunction);
    }
#endif
    HeapBucket::EnumerateObjects(heapBlockList, infoBits, CallBackFunction);
}